

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day15a.cpp
# Opt level: O0

istream * day15a::operator>>(istream *is,Disc *disc)

{
  istream *piVar1;
  string local_38 [8];
  string d;
  Disc *disc_local;
  istream *is_local;
  
  d.field_2._8_8_ = disc;
  std::__cxx11::string::string(local_38);
  piVar1 = std::operator>>(is,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = (istream *)std::istream::operator>>(piVar1,(int *)(d.field_2._8_8_ + 4));
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = std::operator>>(piVar1,local_38);
  piVar1 = (istream *)std::istream::operator>>(piVar1,(int *)d.field_2._8_8_);
  piVar1 = std::operator>>(piVar1,local_38);
  std::__cxx11::string::~string(local_38);
  return piVar1;
}

Assistant:

std::istream& operator >> (std::istream& is, Disc& disc) {
		std::string d;
		return is >> d >> d >> d >> disc.max >> d >> d >> d >> d >> d >> d >> d >> disc.position >> d;
	}